

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O2

void iter_set_info(lzma_index_iter *iter)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  lzma_vli *plVar3;
  size_t sVar4;
  lzma_stream_flags *plVar5;
  lzma_vli lVar6;
  lzma_vli lVar7;
  lzma_vli *plVar8;
  index_group *g;
  long lVar9;
  undefined1 auVar10 [16];
  
  pauVar2 = (undefined1 (*) [16])iter->internal[1].s;
  plVar3 = (lzma_vli *)iter->internal[2].p;
  sVar4 = iter->internal[3].s;
  if (plVar3 == (lzma_vli *)0x0) {
    if (*(long *)(pauVar2[3] + 8) != 0) {
      __assert_fail("stream->groups.root == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                    ,0x3de,"void iter_set_info(lzma_index_iter *)");
    }
    iter->internal[4].s = 2;
  }
  else if ((*(undefined1 (**) [16])(iter->internal[0].s + 0x10) == pauVar2) &&
          (*(lzma_vli **)(pauVar2[4] + 8) == plVar3)) {
    if (*(lzma_vli **)pauVar2[4] == plVar3) {
      if (*(lzma_vli **)(pauVar2[3] + 8) != plVar3) {
        __assert_fail("stream->groups.root == &group->node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                      ,0x3f1,"void iter_set_info(lzma_index_iter *)");
      }
      if (plVar3[2] != 0) {
        __assert_fail("group->node.parent == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                      ,0x3f2,"void iter_set_info(lzma_index_iter *)");
      }
      iter->internal[4].s = 2;
      iter->internal[2].p = (void *)0x0;
    }
    else {
      if (*(lzma_vli **)(pauVar2[3] + 8) == plVar3) {
        __assert_fail("stream->groups.root != &group->node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                      ,0x3ea,"void iter_set_info(lzma_index_iter *)");
      }
      if (*(lzma_vli **)(plVar3[2] + 0x20) != plVar3) {
        __assert_fail("group->node.parent->right == &group->node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                      ,0x3eb,"void iter_set_info(lzma_index_iter *)");
      }
      iter->internal[4].s = 1;
      iter->internal[2] = *(anon_union_8_3_4e90d293 *)(plVar3 + 2);
    }
  }
  else {
    iter->internal[4].p = (void *)0x0;
  }
  (iter->stream).number = (ulong)*(uint *)(pauVar2[2] + 8);
  lVar6 = *(lzma_vli *)(pauVar2[5] + 8);
  (iter->stream).block_count = lVar6;
  auVar1 = *pauVar2;
  auVar10._0_8_ = auVar1._8_8_;
  auVar10._8_4_ = auVar1._0_4_;
  auVar10._12_4_ = auVar1._4_4_;
  (iter->stream).compressed_offset = auVar10._0_8_;
  (iter->stream).uncompressed_offset = auVar10._8_8_;
  plVar5 = (lzma_stream_flags *)0x0;
  if (*(int *)(pauVar2[6] + 8) != -1) {
    plVar5 = (lzma_stream_flags *)(pauVar2[6] + 8);
  }
  (iter->stream).flags = plVar5;
  (iter->stream).padding = *(lzma_vli *)pauVar2[10];
  lVar9 = *(long *)(pauVar2[4] + 8);
  if (lVar9 == 0) {
    lVar6 = 0;
    lVar7 = index_size(0,0);
    (iter->stream).compressed_size = lVar7 + 0x18;
  }
  else {
    lVar6 = index_size(lVar6,*(lzma_vli *)pauVar2[6]);
    lVar7 = vli_ceil4(*(lzma_vli *)(lVar9 + 0x48 + *(long *)(lVar9 + 0x38) * 0x10));
    (iter->stream).compressed_size = lVar7 + lVar6 + 0x18;
    lVar6 = *(lzma_vli *)(lVar9 + 0x40 + *(long *)(lVar9 + 0x38) * 0x10);
  }
  (iter->stream).uncompressed_size = lVar6;
  if (plVar3 != (lzma_vli *)0x0) {
    lVar6 = plVar3[5];
    (iter->block).number_in_stream = lVar6 + sVar4;
    (iter->block).number_in_file = lVar6 + sVar4 + *(long *)pauVar2[3];
    if (sVar4 == 0) {
      lVar6 = plVar3[1];
      lVar9 = -1;
    }
    else {
      lVar9 = sVar4 - 1;
      lVar6 = vli_ceil4(plVar3[lVar9 * 2 + 9]);
    }
    (iter->block).compressed_stream_offset = lVar6;
    plVar8 = plVar3 + lVar9 * 2 + 8;
    if (sVar4 == 0) {
      plVar8 = plVar3;
    }
    lVar7 = *plVar8;
    (iter->block).uncompressed_stream_offset = lVar7;
    (iter->block).uncompressed_size = plVar3[sVar4 * 2 + 8] - lVar7;
    lVar7 = plVar3[sVar4 * 2 + 9];
    (iter->block).unpadded_size = lVar7 - lVar6;
    lVar6 = vli_ceil4(lVar7 - lVar6);
    (iter->block).total_size = lVar6;
    lVar6 = (iter->stream).uncompressed_offset;
    lVar7 = (iter->block).compressed_stream_offset + 0xc;
    (iter->block).compressed_stream_offset = lVar7;
    (iter->block).compressed_file_offset = lVar7 + (iter->stream).compressed_offset;
    (iter->block).uncompressed_file_offset = lVar6 + (iter->block).uncompressed_stream_offset;
  }
  return;
}

Assistant:

static void
iter_set_info(lzma_index_iter *iter)
{
	const lzma_index *i = iter->internal[ITER_INDEX].p;
	const index_stream *stream = iter->internal[ITER_STREAM].p;
	const index_group *group = iter->internal[ITER_GROUP].p;
	const size_t record = iter->internal[ITER_RECORD].s;

	// lzma_index_iter.internal must not contain a pointer to the last
	// group in the index, because that may be reallocated by
	// lzma_index_cat().
	if (group == NULL) {
		// There are no groups.
		assert(stream->groups.root == NULL);
		iter->internal[ITER_METHOD].s = ITER_METHOD_LEFTMOST;

	} else if (i->streams.rightmost != &stream->node
			|| stream->groups.rightmost != &group->node) {
		// The group is not not the last group in the index.
		iter->internal[ITER_METHOD].s = ITER_METHOD_NORMAL;

	} else if (stream->groups.leftmost != &group->node) {
		// The group isn't the only group in the Stream, thus we
		// know that it must have a parent group i.e. it's not
		// the root node.
		assert(stream->groups.root != &group->node);
		assert(group->node.parent->right == &group->node);
		iter->internal[ITER_METHOD].s = ITER_METHOD_NEXT;
		iter->internal[ITER_GROUP].p = group->node.parent;

	} else {
		// The Stream has only one group.
		assert(stream->groups.root == &group->node);
		assert(group->node.parent == NULL);
		iter->internal[ITER_METHOD].s = ITER_METHOD_LEFTMOST;
		iter->internal[ITER_GROUP].p = NULL;
	}

	// NOTE: lzma_index_iter.stream.number is lzma_vli but we use uint32_t
	// internally.
	iter->stream.number = stream->number;
	iter->stream.block_count = stream->record_count;
	iter->stream.compressed_offset = stream->node.compressed_base;
	iter->stream.uncompressed_offset = stream->node.uncompressed_base;

	// iter->stream.flags will be NULL if the Stream Flags haven't been
	// set with lzma_index_stream_flags().
	iter->stream.flags = stream->stream_flags.version == UINT32_MAX
			? NULL : &stream->stream_flags;
	iter->stream.padding = stream->stream_padding;

	if (stream->groups.rightmost == NULL) {
		// Stream has no Blocks.
		iter->stream.compressed_size = index_size(0, 0)
				+ 2 * LZMA_STREAM_HEADER_SIZE;
		iter->stream.uncompressed_size = 0;
	} else {
		const index_group *g = (const index_group *)(
				stream->groups.rightmost);

		// Stream Header + Stream Footer + Index + Blocks
		iter->stream.compressed_size = 2 * LZMA_STREAM_HEADER_SIZE
				+ index_size(stream->record_count,
					stream->index_list_size)
				+ vli_ceil4(g->records[g->last].unpadded_sum);
		iter->stream.uncompressed_size
				= g->records[g->last].uncompressed_sum;
	}

	if (group != NULL) {
		iter->block.number_in_stream = group->number_base + record;
		iter->block.number_in_file = iter->block.number_in_stream
				+ stream->block_number_base;

		iter->block.compressed_stream_offset
				= record == 0 ? group->node.compressed_base
				: vli_ceil4(group->records[
					record - 1].unpadded_sum);
		iter->block.uncompressed_stream_offset
				= record == 0 ? group->node.uncompressed_base
				: group->records[record - 1].uncompressed_sum;

		iter->block.uncompressed_size
				= group->records[record].uncompressed_sum
				- iter->block.uncompressed_stream_offset;
		iter->block.unpadded_size
				= group->records[record].unpadded_sum
				- iter->block.compressed_stream_offset;
		iter->block.total_size = vli_ceil4(iter->block.unpadded_size);

		iter->block.compressed_stream_offset
				+= LZMA_STREAM_HEADER_SIZE;

		iter->block.compressed_file_offset
				= iter->block.compressed_stream_offset
				+ iter->stream.compressed_offset;
		iter->block.uncompressed_file_offset
				= iter->block.uncompressed_stream_offset
				+ iter->stream.uncompressed_offset;
	}

	return;
}